

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::operator+=(path *this,path *x)

{
  path *ppVar1;
  path *x_local;
  path *this_local;
  
  ppVar1 = concat<std::__cxx11::string>(this,&x->_path);
  return ppVar1;
}

Assistant:

GHC_INLINE path& path::operator+=(const path& x)
{
    return concat(x._path);
}